

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFOBSFireFightingFactored.cpp
# Opt level: O1

Scope * __thiscall
ProblemFOBSFireFightingFactored::GetHousesAgentInfluences
          (Scope *__return_storage_ptr__,ProblemFOBSFireFightingFactored *this,Index agI)

{
  iterator __position;
  undefined8 in_RAX;
  ulong uVar1;
  uint uVar2;
  undefined8 uStack_28;
  
  (__return_storage_ptr__->super_SDT).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_SDT).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_SDT).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (*(long *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.field_0x710 != 0)
  {
    uVar2 = 1;
    uStack_28 = in_RAX;
    do {
      uStack_28 = CONCAT44(uVar2 - 1,(undefined4)uStack_28);
      __position._M_current =
           (__return_storage_ptr__->super_SDT).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super_SDT).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                   __position,(uint *)((long)&uStack_28 + 4));
      }
      else {
        *__position._M_current = uVar2 - 1;
        (__return_storage_ptr__->super_SDT).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar1 = (ulong)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar1 < *(ulong *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
                                field_0x710);
  }
  return __return_storage_ptr__;
}

Assistant:

Scope ProblemFOBSFireFightingFactored::GetHousesAgentInfluences(Index agI) const
{
    Scope allHouses;
    for(Index hI=0; hI < _m_nrHouses; hI++)
        allHouses.Insert(hI);
    return(allHouses);
}